

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_seckey_negate(secp256k1_context *ctx,uchar *seckey)

{
  uint uVar1;
  uint uVar2;
  int vflag;
  unsigned_long _zzq_result;
  secp256k1_scalar sec;
  unsigned_long _zzq_args [6];
  uint local_4c [3];
  secp256k1_scalar *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_seckey_negate_cold_2();
  }
  else if (seckey != (uchar *)0x0) {
    uVar1 = secp256k1_scalar_set_b32_seckey(local_4c,seckey);
    secp256k1_scalar_verify(&secp256k1_scalar_zero);
    local_4c[1] = 0x4d430005;
    local_4c[2] = 0;
    local_38 = 4;
    local_30 = 0;
    local_28 = 0;
    local_20 = 0;
    local_4c[0] = local_4c[0] & (uVar1 ^ 1) - 1;
    local_40 = local_4c;
    secp256k1_scalar_verify(local_4c);
    secp256k1_scalar_verify(local_4c);
    uVar2 = 0xd - local_4c[0];
    if (local_4c[0] == 0) {
      uVar2 = 0;
    }
    local_4c[0] = uVar2;
    secp256k1_scalar_verify(local_4c);
    secp256k1_scalar_verify(local_4c);
    seckey[0x10] = '\0';
    seckey[0x11] = '\0';
    seckey[0x12] = '\0';
    seckey[0x13] = '\0';
    seckey[0x14] = '\0';
    seckey[0x15] = '\0';
    seckey[0x16] = '\0';
    seckey[0x17] = '\0';
    seckey[0x18] = '\0';
    seckey[0x19] = '\0';
    seckey[0x1a] = '\0';
    seckey[0x1b] = '\0';
    seckey[0x1c] = '\0';
    seckey[0x1d] = '\0';
    seckey[0x1e] = '\0';
    seckey[0x1f] = '\0';
    seckey[0] = '\0';
    seckey[1] = '\0';
    seckey[2] = '\0';
    seckey[3] = '\0';
    seckey[4] = '\0';
    seckey[5] = '\0';
    seckey[6] = '\0';
    seckey[7] = '\0';
    seckey[8] = '\0';
    seckey[9] = '\0';
    seckey[10] = '\0';
    seckey[0xb] = '\0';
    seckey[0xc] = '\0';
    seckey[0xd] = '\0';
    seckey[0xe] = '\0';
    seckey[0xf] = '\0';
    *(uint *)(seckey + 0x1c) =
         local_4c[0] >> 0x18 | (local_4c[0] & 0xff0000) >> 8 | (local_4c[0] & 0xff00) << 8 |
         local_4c[0] << 0x18;
    return uVar1;
  }
  secp256k1_ec_seckey_negate_cold_1();
  return 0;
}

Assistant:

int secp256k1_ec_seckey_negate(const secp256k1_context* ctx, unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_negate(&sec, &sec);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    return ret;
}